

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O1

mapped_type __thiscall ChebTools::MonomialCoefficients::get_coeffs(MonomialCoefficients *this,int n)

{
  long *plVar1;
  __buckets_ptr __ptr;
  size_type sVar2;
  mapped_type *pmVar3;
  DenseStorage<double,__1,__1,_1,_0> *other;
  int in_EDX;
  ulong uVar4;
  Index extraout_RDX;
  undefined4 in_register_00000034;
  _Map_base<int,_std::pair<const_int,_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<const_int,_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_00;
  long *plVar5;
  long *plVar6;
  mapped_type mVar7;
  key_type local_24;
  __buckets_ptr local_20;
  size_type local_18;
  
  this_00 = (_Map_base<int,_std::pair<const_int,_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<const_int,_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             *)CONCAT44(in_register_00000034,n);
  uVar4 = (ulong)(long)in_EDX % *(ulong *)(this_00 + 8);
  plVar5 = *(long **)(*(long *)this_00 + uVar4 * 8);
  plVar6 = (long *)0x0;
  if ((plVar5 != (long *)0x0) &&
     (plVar1 = (long *)*plVar5, plVar6 = plVar5, *(int *)((long *)*plVar5 + 1) != in_EDX)) {
    while (plVar5 = plVar1, plVar1 = (long *)*plVar5, plVar1 != (long *)0x0) {
      plVar6 = (long *)0x0;
      if (((ulong)(long)(int)plVar1[1] % *(ulong *)(this_00 + 8) != uVar4) ||
         (plVar6 = plVar5, (int)plVar1[1] == in_EDX)) goto LAB_0010ac97;
    }
    plVar6 = (long *)0x0;
  }
LAB_0010ac97:
  if ((plVar6 == (long *)0x0) || (*plVar6 == 0)) {
    calc_coeffs((MonomialCoefficients *)&stack0xffffffffffffffe0,n);
    pmVar3 = std::__detail::
             _Map_base<int,_std::pair<const_int,_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>,_std::allocator<std::pair<const_int,_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[](this_00,&local_24);
    __ptr = (__buckets_ptr)
            (pmVar3->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
    ;
    (pmVar3->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
         (double *)local_20;
    sVar2 = (pmVar3->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
    ;
    (pmVar3->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows =
         local_18;
    local_20 = __ptr;
    local_18 = sVar2;
    free(__ptr);
  }
  other = (DenseStorage<double,__1,__1,_1,_0> *)
          std::__detail::
          _Map_base<int,_std::pair<const_int,_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>,_std::allocator<std::pair<const_int,_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
          ::operator[](this_00,&local_24);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)this,other);
  mVar7.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  mVar7.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (mapped_type)mVar7.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

auto get_coeffs(int n){
            if (store.find(n) == store.end()){
                store[n] = calc_coeffs(n);
            }
            return store[n];
        }